

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<LargeBlock<256,_256>_*,_false,_false>::grow_and_add
          (FastVector<LargeBlock<256,_256>_*,_false,_false> *this,uint newSize,
          LargeBlock<256,_256> **val)

{
  uint uVar1;
  uint uVar2;
  LargeBlock<256,_256> **ptr;
  LargeBlock<256,_256> *pLVar3;
  uint oldMax;
  LargeBlock<256,_256> **oldData;
  LargeBlock<256,_256> **val_local;
  uint newSize_local;
  FastVector<LargeBlock<256,_256>_*,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  pLVar3 = *val;
  uVar2 = this->count;
  this->count = uVar2 + 1;
  this->data[uVar2] = pLVar3;
  if (ptr != (LargeBlock<256,_256> **)0x0) {
    NULLC::destruct<LargeBlock<256,256>*>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}